

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Glucose::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  vec<unsigned_int> *pvVar8;
  int j;
  long lVar9;
  
  if (this->use_simplification == true) {
    this_00 = &(this->super_Solver).ca;
    for (lVar7 = 0; lVar7 < (this->super_Solver).vardata.sz; lVar7 = lVar7 + 1) {
      pvVar8 = (this->occurs).occs.data + lVar7;
      lVar5 = 0;
      for (lVar9 = 0; lVar9 < pvVar8->sz; lVar9 = lVar9 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar8->data + lVar5),to);
        lVar5 = lVar5 + 4;
      }
    }
    iVar4 = 0;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar2 = (this->subsumption_queue).buf.sz;
      iVar3 = (this->subsumption_queue).first;
      iVar6 = 0;
      if (iVar1 < iVar3) {
        iVar6 = iVar2;
      }
      if ((iVar1 - iVar3) + iVar6 <= iVar4) break;
      ClauseAllocator::reloc
                (this_00,(this->subsumption_queue).buf.data + (iVar3 + iVar4) % iVar2,to);
      iVar4 = iVar4 + 1;
    }
    ClauseAllocator::reloc(this_00,&this->bwdsub_tmpunit,to);
    return;
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}